

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O3

Object * __thiscall
nvim::Nvim::get_proc_abi_cxx11_(Object *__return_storage_ptr__,Nvim *this,Integer pid)

{
  Integer local_40;
  string local_38;
  
  (__return_storage_ptr__->super_variant<_cf2d41c5_>).which_ = 0;
  local_40 = pid;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"nvim_get_proc","");
  NvimRPC::call<long>(&this->client_,&local_38,__return_storage_ptr__,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Object Nvim::get_proc(Integer pid) {
    Object res;
    client_.call("nvim_get_proc", res, pid);
    return res;
}